

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::MultiNode<unsigned_long,_int>_>::Data
          (Data<QHashPrivate::MultiNode<unsigned_long,_int>_> *this,
          Data<QHashPrivate::MultiNode<unsigned_long,_int>_> *other)

{
  unsigned_long uVar1;
  bool bVar2;
  MultiNode<unsigned_long,_int> *in_RSI;
  Span<QHashPrivate::MultiNode<unsigned_long,_int>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar3;
  MultiNode<unsigned_long,_int> *newNode;
  MultiNode<unsigned_long,_int> *n;
  size_t index;
  Span *span;
  size_t s;
  R r;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff80;
  Span<QHashPrivate::MultiNode<unsigned_long,_int>_> *this_00;
  MultiNode<unsigned_long,_int> *other_00;
  Span<QHashPrivate::MultiNode<unsigned_long,_int>_> *this_01;
  ulong local_58;
  ulong local_48;
  size_t in_stack_ffffffffffffffc0;
  Span *local_28;
  size_t local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff80,(int)((ulong)in_RDI >> 0x20));
  *(Chain **)(in_RDI->offsets + 8) = in_RSI->value;
  *(unsigned_long *)(in_RDI->offsets + 0x10) = in_RSI[1].key;
  *(Chain **)(in_RDI->offsets + 0x18) = in_RSI[1].value;
  in_RDI->offsets[0x20] = '\0';
  in_RDI->offsets[0x21] = '\0';
  in_RDI->offsets[0x22] = '\0';
  in_RDI->offsets[0x23] = '\0';
  in_RDI->offsets[0x24] = '\0';
  in_RDI->offsets[0x25] = '\0';
  in_RDI->offsets[0x26] = '\0';
  in_RDI->offsets[0x27] = '\0';
  RVar3 = allocateSpans(in_stack_ffffffffffffffc0);
  local_28 = RVar3.spans;
  *(Span **)(in_RDI->offsets + 0x20) = local_28;
  local_20 = RVar3.nSpans;
  this_00 = in_RDI;
  other_00 = in_RSI;
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    uVar1 = in_RSI[2].key;
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
      bVar2 = Span<QHashPrivate::MultiNode<unsigned_long,_int>_>::hasNode
                        ((Span<QHashPrivate::MultiNode<unsigned_long,_int>_> *)
                         (uVar1 + local_48 * 0x90),local_58);
      if (bVar2) {
        Span<QHashPrivate::MultiNode<unsigned_long,_int>_>::at(this_00,(size_t)in_RDI);
        local_18.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
        local_18.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
        Bucket::Bucket(&local_18,(Span *)(*(long *)(this_00->offsets + 0x20) + local_48 * 0x90),
                       local_58);
        Bucket::insert((Bucket *)0x85921b);
        MultiNode<unsigned_long,_int>::MultiNode((MultiNode<unsigned_long,_int> *)this_01,other_00);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }